

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileHTTP.cpp
# Opt level: O1

void __thiscall
adios2::transport::FileHTTP::Read(FileHTTP *this,char *buffer,size_t size,size_t start)

{
  bool bVar1;
  uint uVar2;
  uint __val;
  int iVar3;
  long *plVar4;
  ssize_t sVar5;
  uint uVar6;
  size_type *psVar7;
  size_t __nbytes;
  uint __len;
  FileHTTP *pFVar8;
  ulong uVar9;
  string __str;
  char request [1024];
  string local_4f0;
  string local_4d0;
  string local_4b0;
  string local_490;
  FileHTTP *local_470;
  size_t local_468;
  char *local_460;
  char *local_458 [2];
  char local_448 [16];
  char local_438 [1032];
  
  local_460 = buffer;
  memset(local_438,0,0x400);
  local_470 = this;
  local_468 = size;
  __val = snprintf(local_438,0x400,(this->request_template)._M_dataplus._M_p,
                   (this->super_Transport).m_Name._M_dataplus._M_p,
                   (this->m_hostname)._M_dataplus._M_p,start,(size - 1) + start);
  if (0x3ff < (int)__val) {
    local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f0,"Toolkit","");
    local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_490,"transport::file::FileHTTP","");
    local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b0,"Read","");
    uVar6 = __val;
    uVar2 = 4;
    do {
      __len = uVar2;
      if (uVar6 < 100) {
        __len = __len - 2;
        goto LAB_0065a935;
      }
      if (uVar6 < 1000) {
        __len = __len - 1;
        goto LAB_0065a935;
      }
      if (uVar6 < 10000) goto LAB_0065a935;
      bVar1 = 99999 < uVar6;
      uVar6 = uVar6 / 10000;
      uVar2 = __len + 4;
    } while (bVar1);
    __len = __len + 1;
LAB_0065a935:
    local_458[0] = local_448;
    std::__cxx11::string::_M_construct((ulong)local_458,(char)__len);
    std::__detail::__to_chars_10_impl<unsigned_int>(local_458[0],__len,__val);
    plVar4 = (long *)std::__cxx11::string::replace((ulong)local_458,0,(char *)0x0,0x76041c);
    psVar7 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_4d0.field_2._M_allocated_capacity = *psVar7;
      local_4d0.field_2._8_8_ = plVar4[3];
      local_4d0._M_dataplus._M_p = (pointer)&local_4d0.field_2;
    }
    else {
      local_4d0.field_2._M_allocated_capacity = *psVar7;
      local_4d0._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_4d0._M_string_length = plVar4[1];
    *plVar4 = (long)psVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    helper::Throw<std::ios_base::failure[abi:cxx11]>(&local_4f0,&local_490,&local_4b0,&local_4d0,-1)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
      operator_delete(local_4d0._M_dataplus._M_p);
    }
    if (local_458[0] != local_448) {
      operator_delete(local_458[0]);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
      operator_delete(local_4b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_490._M_dataplus._M_p != &local_490.field_2) {
      operator_delete(local_490._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
      operator_delete(local_4f0._M_dataplus._M_p);
    }
  }
  pFVar8 = local_470;
  iVar3 = socket(2,1,local_470->m_p_proto);
  pFVar8->m_socketFileDescriptor = iVar3;
  if (iVar3 == -1) {
    local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f0,"Toolkit","");
    local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_490,"transport::file::FileHTTP","");
    local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b0,"Read","");
    local_4d0._M_dataplus._M_p = (pointer)&local_4d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d0,"cannot open socket","");
    helper::Throw<std::ios_base::failure[abi:cxx11]>(&local_4f0,&local_490,&local_4b0,&local_4d0,-1)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
      operator_delete(local_4d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
      operator_delete(local_4b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_490._M_dataplus._M_p != &local_490.field_2) {
      operator_delete(local_490._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
      operator_delete(local_4f0._M_dataplus._M_p);
    }
  }
  iVar3 = connect(pFVar8->m_socketFileDescriptor,(sockaddr *)&pFVar8->sockaddr_in,0x10);
  if (iVar3 == -1) {
    local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f0,"Toolkit","");
    local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_490,"transport::file::FileHTTP","");
    local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b0,"Read","");
    local_4d0._M_dataplus._M_p = (pointer)&local_4d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d0,"cannot connect","");
    helper::Throw<std::ios_base::failure[abi:cxx11]>(&local_4f0,&local_490,&local_4b0,&local_4d0,-1)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
      operator_delete(local_4d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
      operator_delete(local_4b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_490._M_dataplus._M_p != &local_490.field_2) {
      operator_delete(local_490._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
      operator_delete(local_4f0._M_dataplus._M_p);
    }
  }
  if (0 < (int)__val) {
    iVar3 = 0;
    do {
      sVar5 = write(pFVar8->m_socketFileDescriptor,local_438 + iVar3,(long)(int)(__val - iVar3));
      if ((int)sVar5 == -1) {
        local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f0,"Toolkit","");
        local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_490,"transport::file::FileHTTP","");
        local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b0,"Read","");
        local_4d0._M_dataplus._M_p = (pointer)&local_4d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_4d0,"cannot send request","");
        helper::Throw<std::ios_base::failure[abi:cxx11]>
                  (&local_4f0,&local_490,&local_4b0,&local_4d0,-1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
          operator_delete(local_4d0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
          operator_delete(local_4b0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_490._M_dataplus._M_p != &local_490.field_2) {
          operator_delete(local_490._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
          operator_delete(local_4f0._M_dataplus._M_p);
        }
      }
      iVar3 = iVar3 + (int)sVar5;
      pFVar8 = local_470;
    } while (iVar3 < (int)__val);
  }
  if (local_468 != 0) {
    uVar9 = 0;
    do {
      __nbytes = local_468 - uVar9;
      if (0x1fff < __nbytes) {
        __nbytes = 0x2000;
      }
      sVar5 = read(pFVar8->m_socketFileDescriptor,local_460 + uVar9,__nbytes);
      if ((int)sVar5 == -1) {
        local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f0,"Toolkit","");
        local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_490,"transport::file::FileHTTP","");
        local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b0,"Read","");
        local_4d0._M_dataplus._M_p = (pointer)&local_4d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_4d0,"cannot get response","");
        helper::Throw<std::ios_base::failure[abi:cxx11]>
                  (&local_4f0,&local_490,&local_4b0,&local_4d0,-1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
          operator_delete(local_4d0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
          operator_delete(local_4b0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_490._M_dataplus._M_p != &local_490.field_2) {
          operator_delete(local_490._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
          operator_delete(local_4f0._M_dataplus._M_p);
        }
      }
      uVar9 = uVar9 + (long)(int)sVar5;
      pFVar8 = local_470;
    } while (uVar9 < local_468);
  }
  close(pFVar8->m_socketFileDescriptor);
  return;
}

Assistant:

void FileHTTP::Read(char *buffer, size_t size, size_t start)
{
    /* not using BUFSIZ, the server might use another value for that */
    const size_t BUF_SIZE = 8192;
    enum CONSTEXPR
    {
        MAX_REQUEST_LEN = 1024
    };
    char request[MAX_REQUEST_LEN] = {'\0'};
    int request_len = snprintf(request, MAX_REQUEST_LEN, request_template.c_str(), m_Name.c_str(),
                               m_hostname.c_str(), start, start + size - 1);
    if (request_len >= MAX_REQUEST_LEN)
    {
        helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FileHTTP", "Read",
                                              "request length too long:  " +
                                                  std::to_string(request_len));
    }
    m_socketFileDescriptor = socket(AF_INET, SOCK_STREAM, m_p_proto);
    if (m_socketFileDescriptor == -1)
    {
        helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FileHTTP", "Read",
                                              "cannot open socket");
    }
    /* Actually connect. */
    if (connect(m_socketFileDescriptor, (struct sockaddr *)&sockaddr_in, sizeof(sockaddr_in)) == -1)
    {
        helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FileHTTP", "Read",
                                              "cannot connect");
    }
    /* Send HTTP request. */
    int nbytes_total = 0;
    while (nbytes_total < request_len)
    {
        int nbytes_last =
            write(m_socketFileDescriptor, request + nbytes_total, request_len - nbytes_total);
        if (nbytes_last == -1)
        {
            helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FileHTTP", "Read",
                                                  "cannot send request");
        }
        nbytes_total += nbytes_last;
    }

    /* Read the response. */
    size_t bytes_recd = 0;
    while (bytes_recd < size)
    {
        size_t remaining = size - bytes_recd;
        int read_len = (int)(remaining < BUF_SIZE ? remaining : BUF_SIZE);
        nbytes_total = read(m_socketFileDescriptor, buffer + bytes_recd, read_len);
        if (nbytes_total == -1)
        {
            helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FileHTTP", "Read",
                                                  "cannot get response");
        }
        bytes_recd += nbytes_total;
    }

    close(m_socketFileDescriptor);
    return;
}